

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool __thiscall FPolyObj::MovePolyobj(FPolyObj *this,DVector2 *pos,bool force)

{
  FBoundingBox bounds;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  side_t **ppsVar4;
  FBoundingBox local_80;
  TVector2<double> local_60;
  uint local_50;
  byte local_49;
  uint i;
  bool blocked;
  FBoundingBox oldbounds;
  bool force_local;
  DVector2 *pos_local;
  FPolyObj *this_local;
  
  _i = (this->Bounds).m_Box[0];
  oldbounds.m_Box[0] = (this->Bounds).m_Box[1];
  oldbounds.m_Box[1] = (this->Bounds).m_Box[2];
  oldbounds.m_Box[2] = (this->Bounds).m_Box[3];
  oldbounds.m_Box[3]._7_1_ = force;
  UnLinkPolyobj(this);
  DoMovePolyobj(this,pos);
  if ((oldbounds.m_Box[3]._7_1_ & 1) == 0) {
    local_49 = 0;
    for (local_50 = 0; uVar1 = local_50, uVar3 = TArray<side_t_*,_side_t_*>::Size(&this->Sidedefs),
        uVar1 < uVar3; local_50 = local_50 + 1) {
      ppsVar4 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)local_50);
      bVar2 = CheckMobjBlocking(this,*ppsVar4);
      if (bVar2) {
        local_49 = 1;
      }
    }
    if ((local_49 & 1) != 0) {
      TVector2<double>::operator-(&local_60);
      DoMovePolyobj(this,&local_60);
      LinkPolyobj(this);
      return false;
    }
  }
  TVector2<double>::operator+=(&(this->StartSpot).pos,pos);
  TVector2<double>::operator+=(&(this->CenterSpot).pos,pos);
  LinkPolyobj(this);
  ClearSubsectorLinks(this);
  FBoundingBox::operator|(&local_80,&this->Bounds,(FBoundingBox *)&i);
  bounds.m_Box[1] = local_80.m_Box[1];
  bounds.m_Box[0] = local_80.m_Box[0];
  bounds.m_Box[2] = local_80.m_Box[2];
  bounds.m_Box[3] = local_80.m_Box[3];
  RecalcActorFloorCeil(this,bounds);
  return true;
}

Assistant:

bool FPolyObj::MovePolyobj (const DVector2 &pos, bool force)
{
	FBoundingBox oldbounds = Bounds;
	UnLinkPolyobj ();
	DoMovePolyobj (pos);

	if (!force)
	{
		bool blocked = false;

		for(unsigned i=0;i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			DoMovePolyobj (-pos);
			LinkPolyobj();
			return false;
		}
	}
	StartSpot.pos += pos;
	CenterSpot.pos += pos;
	LinkPolyobj ();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}